

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<float,duckdb::TemplatedParquetValueConversion<float>,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  idx_t row_idx;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  data_ptr_t local_40;
  idx_t local_38;
  
  local_40 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    local_48 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    do {
      if (this->column_schema->max_define == (ulong)defines[result_offset]) {
        ByteBuffer::available(plain_data,4);
        uVar1 = *(undefined4 *)plain_data->ptr;
        plain_data->len = plain_data->len - 4;
        plain_data->ptr = plain_data->ptr + 4;
        *(undefined4 *)(local_40 + result_offset * 4) = uVar1;
      }
      else {
        _Var6._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var6._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var6._M_head_impl =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var6._M_head_impl;
        }
        bVar2 = (byte)result_offset & 0x3f;
        _Var6._M_head_impl[result_offset >> 6] =
             _Var6._M_head_impl[result_offset >> 6] &
             (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      result_offset = result_offset + 1;
      num_values = num_values - 1;
    } while (num_values != 0);
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}